

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcReconv.c
# Opt level: O1

void Abc_NodeConeCollect(Abc_Obj_t **ppRoots,int nRoots,Vec_Ptr_t *vLeaves,Vec_Ptr_t *vVisited,
                        int fIncludeFanins)

{
  uint *puVar1;
  uint uVar2;
  void *pvVar3;
  long lVar4;
  void **ppvVar5;
  int iVar6;
  ulong uVar7;
  
  if (0 < vLeaves->nSize) {
    lVar4 = 0;
    do {
      puVar1 = (uint *)((long)vLeaves->pArray[lVar4] + 0x14);
      *puVar1 = *puVar1 | 0x10;
      lVar4 = lVar4 + 1;
    } while (lVar4 < vLeaves->nSize);
  }
  vVisited->nSize = 0;
  if ((fIncludeFanins != 0) && (0 < vLeaves->nSize)) {
    lVar4 = 0;
    do {
      pvVar3 = vLeaves->pArray[lVar4];
      uVar2 = vVisited->nCap;
      if (vVisited->nSize == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (vVisited->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(vVisited->pArray,0x80);
          }
          vVisited->pArray = ppvVar5;
          iVar6 = 0x10;
        }
        else {
          iVar6 = uVar2 * 2;
          if (iVar6 <= (int)uVar2) goto LAB_0028e42c;
          if (vVisited->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
          }
          else {
            ppvVar5 = (void **)realloc(vVisited->pArray,(ulong)uVar2 << 4);
          }
          vVisited->pArray = ppvVar5;
        }
        vVisited->nCap = iVar6;
      }
LAB_0028e42c:
      iVar6 = vVisited->nSize;
      vVisited->nSize = iVar6 + 1;
      vVisited->pArray[iVar6] = pvVar3;
      lVar4 = lVar4 + 1;
    } while (lVar4 < vLeaves->nSize);
  }
  if (0 < nRoots) {
    uVar7 = 0;
    do {
      Abc_NodeConeMarkCollect_rec(ppRoots[uVar7],vVisited);
      uVar7 = uVar7 + 1;
    } while ((uint)nRoots != uVar7);
  }
  if (0 < vLeaves->nSize) {
    lVar4 = 0;
    do {
      puVar1 = (uint *)((long)vLeaves->pArray[lVar4] + 0x14);
      *puVar1 = *puVar1 & 0xffffffef;
      lVar4 = lVar4 + 1;
    } while (lVar4 < vLeaves->nSize);
  }
  if (0 < vVisited->nSize) {
    lVar4 = 0;
    do {
      puVar1 = (uint *)((long)vVisited->pArray[lVar4] + 0x14);
      *puVar1 = *puVar1 & 0xffffffef;
      lVar4 = lVar4 + 1;
    } while (lVar4 < vVisited->nSize);
  }
  return;
}

Assistant:

void Abc_NodeConeCollect( Abc_Obj_t ** ppRoots, int nRoots, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vVisited, int fIncludeFanins )
{
    Abc_Obj_t * pTemp;
    int i;
    // mark the fanins of the cone
    Abc_NodesMark( vLeaves );
    // collect the nodes in the DFS order
    Vec_PtrClear( vVisited );
    // add the fanins
    if ( fIncludeFanins )
        Vec_PtrForEachEntry( Abc_Obj_t *, vLeaves, pTemp, i )
            Vec_PtrPush( vVisited, pTemp );
    // add other nodes
    for ( i = 0; i < nRoots; i++ )
        Abc_NodeConeMarkCollect_rec( ppRoots[i], vVisited );
    // unmark both sets
    Abc_NodesUnmark( vLeaves );
    Abc_NodesUnmark( vVisited );
}